

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMessageDocComment
               (Printer *printer,Descriptor *message,int is_descriptor)

{
  bool bVar1;
  string sStack_c8;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pointer local_58;
  pointer pbStack_50;
  pointer local_48;
  string local_40;
  
  io::Printer::Print<>(printer,"/**\n");
  local_a8._16_8_ = &local_88;
  local_a8._24_8_ = 0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58 = (pointer)0x0;
  pbStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  bVar1 = Descriptor::GetSourceLocation(message,(SourceLocation *)local_a8);
  if (bVar1) {
    GenerateDocCommentBodyForLocation(printer,(SourceLocation *)local_a8,true,0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_a8);
  FullClassName<google::protobuf::Descriptor>(&local_40,message,is_descriptor != 0);
  EscapePhpdoc((string *)local_a8,&local_40);
  EscapePhpdoc(&sStack_c8,*(string **)(message + 8));
  io::Printer::Print<char[9],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer," * Generated from protobuf message <code>^messagename^</code>\n */\n",
             (char (*) [9])"fullname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
             (char (*) [12])"messagename",&sStack_c8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void GenerateMessageDocComment(io::Printer* printer,
                               const Descriptor* message, int is_descriptor) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, message);
  printer->Print(
    " * Generated from protobuf message <code>^messagename^</code>\n"
    " */\n",
    "fullname", EscapePhpdoc(FullClassName(message, is_descriptor)),
    "messagename", EscapePhpdoc(message->full_name()));
}